

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChObject.h
# Opt level: O2

shared_ptr<chrono::ChBody> __thiscall
chrono::
ChContainerSearchFromID<std::shared_ptr<chrono::ChBody>,__gnu_cxx::__normal_iterator<std::shared_ptr<chrono::ChBody>*,std::vector<std::shared_ptr<chrono::ChBody>,std::allocator<std::shared_ptr<chrono::ChBody>>>>>
          (chrono *this,int myID,
          __normal_iterator<std::shared_ptr<chrono::ChBody>_*,_std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>_>
          from,__normal_iterator<std::shared_ptr<chrono::ChBody>_*,_std::vector<std::shared_ptr<chrono::ChBody>,_std::allocator<std::shared_ptr<chrono::ChBody>_>_>_>
               to)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chrono::ChBody> sVar1;
  
  do {
    if (from._M_current == to._M_current) {
      *(undefined8 *)this = 0;
      *(undefined8 *)(this + 8) = 0;
LAB_00a8aa74:
      sVar1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)from._M_current;
      sVar1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (shared_ptr<chrono::ChBody>)
             sVar1.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>;
    }
    if ((((element_type *)
         ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)from._M_current)->_vptr__Sp_counted_base)
        ->super_ChPhysicsItem).super_ChObj.m_identifier == myID) {
      std::__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2> *)this,
                 &(from._M_current)->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)
      ;
      from._M_current = (shared_ptr<chrono::ChBody> *)extraout_RDX;
      goto LAB_00a8aa74;
    }
    from._M_current = from._M_current + 1;
  } while( true );
}

Assistant:

T ChContainerSearchFromID(int myID, Iterator from, Iterator to) {
    Iterator iter = from;
    while (iter != to) {
        if (myID == (*iter)->GetIdentifier())
            return (*iter);
        iter++;
    }
    return T(0);
}